

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall
TypedImageChannel<unsigned_int>::resize(TypedImageChannel<unsigned_int> *this,int width,int height)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  Array2D<unsigned_int> *unaff_retaddr;
  
  Imf_3_4::Array2D<unsigned_int>::resizeEraseUnsafe(unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_EDX));
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}